

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIShmChain.cpp
# Opt level: O0

size_t __thiscall adios2::aggregator::MPIShmChain::PreInit(MPIShmChain *this,Comm *parentComm)

{
  int iVar1;
  uint uVar2;
  unsigned_long uVar3;
  Comm *in_RSI;
  long in_RDI;
  int color;
  int NodeRank;
  Comm *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  string *hint;
  string *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  Comm *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  unsigned_long *in_stack_ffffffffffffff98;
  Comm *in_stack_ffffffffffffffa0;
  undefined1 local_39 [41];
  Comm *local_10;
  
  hint = (string *)local_39;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_39 + 1),"creating per-node comm at Open",(allocator *)hint);
  helper::Comm::GroupByShm((Comm *)in_stack_ffffffffffffff78,hint);
  helper::Comm::operator=
            ((Comm *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48);
  helper::Comm::~Comm((Comm *)0xd7513c);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  iVar1 = helper::Comm::Rank((Comm *)0xd75161);
  uVar2 = (uint)(iVar1 != 0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff80,"creating chain of nodes at Open",
             (allocator *)&stack0xffffffffffffff7f);
  helper::Comm::Split(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                      in_stack_ffffffffffffff78);
  helper::Comm::operator=((Comm *)CONCAT44(uVar2,in_stack_ffffffffffffff50),local_10);
  helper::Comm::~Comm((Comm *)0xd751ea);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  if (iVar1 == 0) {
    iVar1 = helper::Comm::Size((Comm *)0xd75217);
    *(long *)(in_RDI + 0x68) = (long)iVar1;
  }
  uVar3 = helper::Comm::BroadcastValue<unsigned_long>
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  *(unsigned_long *)(in_RDI + 0x68) = uVar3;
  *(undefined1 *)(in_RDI + 0x51) = 1;
  return *(size_t *)(in_RDI + 0x68);
}

Assistant:

size_t MPIShmChain::PreInit(helper::Comm const &parentComm)
{
    /* Communicator connecting ranks on each Compute Node */
    m_NodeComm = parentComm.GroupByShm("creating per-node comm at Open");
    int NodeRank = m_NodeComm.Rank();

    /*
     *  Communicators connecting rank N of each node
     *  We are only interested in the chain of rank 0s
     */
    int color = (NodeRank ? 1 : 0);
    m_OnePerNodeComm = parentComm.Split(color, 0, "creating chain of nodes at Open");

    /* Number of nodes */
    if (!NodeRank)
    {
        m_NumNodes = static_cast<size_t>(m_OnePerNodeComm.Size());
    }
    m_NumNodes = m_NodeComm.BroadcastValue<size_t>(m_NumNodes, 0);
    PreInitCalled = true;
    return m_NumNodes;
}